

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O3

void __thiscall tcmalloc::PageHeap::~PageHeap(PageHeap *this)

{
  std::
  _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::~_Rb_tree(&(this->large_returned_)._M_t);
  std::
  _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::~_Rb_tree(&(this->large_normal_)._M_t);
  return;
}

Assistant:

PageHeap() {
        stat.system_bytes = 0;
        stat.normal_bytes = 0;
        stat.returned_bytes = 0;
        stat.in_used_bytes = 0;

        stat.large_normal_bytes = 0;
        stat.large_returned_bytes = 0;

        release_index_ = 0;
        release_rate_ = 100;

        for (int i = 0; i <= spanSmallPages; ++i) {
            ListInit(&small_normal_[i]);
            ListInit(&small_returned_[i]);
        }
    }